

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::NextLetConstGlobal
          (DictionaryTypeHandlerBase<unsigned_short> *this,int *index,RootObjectBase *instance,
          PropertyRecord **propertyRecord,Var *value,bool *isConst)

{
  unsigned_short uVar1;
  int iVar2;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar3;
  PropertyRecord **ppPVar4;
  Var pvVar5;
  int index_00;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar6;
  DictionaryPropertyDescriptor<unsigned_short> local_38;
  
  index_00 = *index;
  this_00 = (this->propertyMap).ptr;
  iVar2 = this_00->count - this_00->freeCount;
  bVar6 = index_00 < iVar2;
  if (index_00 < iVar2) {
    do {
      pDVar3 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_00,index_00);
      local_38 = *pDVar3;
      if (((ulong)local_38 & 0x1000) != 0) {
        ppPVar4 = JsUtil::
                  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetKeyAt((this->propertyMap).ptr,*index);
        *propertyRecord = *ppPVar4;
        uVar1 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(&local_38);
        pvVar5 = DynamicObject::GetSlot(&instance->super_DynamicObject,(uint)uVar1);
        *value = pvVar5;
        *isConst = (bool)(local_38.Attributes >> 7);
        *index = *index + 1;
        return bVar6;
      }
      index_00 = *index + 1;
      *index = index_00;
      this_00 = (this->propertyMap).ptr;
      iVar2 = this_00->count - this_00->freeCount;
      bVar6 = index_00 < iVar2;
    } while (index_00 < iVar2);
  }
  return bVar6;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::NextLetConstGlobal(int& index, RootObjectBase* instance, const PropertyRecord** propertyRecord, Var* value, bool* isConst)
    {
        for (; index < propertyMap->Count(); index++)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(index);

            if (descriptor.Attributes & PropertyLetConstGlobal)
            {
                *propertyRecord = propertyMap->GetKeyAt(index);
                *value = instance->GetSlot(descriptor.template GetDataPropertyIndex<true>());
                *isConst = (descriptor.Attributes & PropertyConst) != 0;

                index += 1;

                return true;
            }
        }

        return false;
    }